

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

PolicyStatus __thiscall cmPolicies::PolicyMap::Get(PolicyMap *this,PolicyID id)

{
  int iVar1;
  
  iVar1 = id * 3;
  if (((this->Status).super__Base_bitset<4UL>._M_w[(ulong)(long)iVar1 >> 6] >> ((long)iVar1 & 0x3fU)
      & 1) != 0) {
    return OLD;
  }
  return (((this->Status).super__Base_bitset<4UL>._M_w[(ulong)(long)(iVar1 + 2) >> 6] >>
           ((long)(iVar1 + 2) & 0x3fU) & 1) != 0) + WARN;
}

Assistant:

cmPolicies::PolicyStatus
cmPolicies::PolicyMap::Get(cmPolicies::PolicyID id) const
{
  PolicyStatus status = cmPolicies::WARN;

  if (this->Status[(POLICY_STATUS_COUNT * id) + OLD])
    {
    status = cmPolicies::OLD;
    }
  else if (this->Status[(POLICY_STATUS_COUNT * id) + NEW])
    {
    status = cmPolicies::NEW;
    }
  return status;
}